

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

void getPixelColorRGBA8(uchar *r,uchar *g,uchar *b,uchar *a,uchar *in,size_t i,
                       LodePNGColorMode *mode)

{
  byte bVar1;
  uchar uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ushort uVar7;
  size_t j;
  
  switch(mode->colortype) {
  case LCT_GREY:
    uVar3 = mode->bitdepth;
    uVar5 = (ulong)uVar3;
    if (uVar5 == 0x10) {
      uVar2 = in[i * 2];
      *b = uVar2;
      *g = uVar2;
      *r = uVar2;
      if ((mode->key_defined != 0) &&
         ((uint)(ushort)(*(ushort *)(in + i * 2) << 8 | *(ushort *)(in + i * 2) >> 8) == mode->key_r
         )) goto LAB_002f9801;
    }
    else {
      if (uVar3 != 8) {
        j = i * uVar5;
        uVar4 = readBitsFromReversedStream(&j,in,uVar5);
        uVar2 = (uchar)((uVar4 * 0xff) / (uint)~(-1 << (uVar3 & 0x1f)));
        *b = uVar2;
        *g = uVar2;
        *r = uVar2;
        if ((mode->key_defined == 0) || (uVar4 != mode->key_r)) {
          uVar2 = 0xff;
        }
        else {
          uVar2 = '\0';
        }
        *a = uVar2;
        return;
      }
      bVar1 = in[i];
      *b = bVar1;
      *g = bVar1;
      *r = bVar1;
      if ((mode->key_defined != 0) && (mode->key_r == (uint)bVar1)) {
LAB_002f9801:
        *a = '\0';
        return;
      }
    }
    goto LAB_002f9806;
  default:
    goto switchD_002f95d8_caseD_1;
  case LCT_RGB:
    if (mode->bitdepth == 8) {
      lVar6 = i * 3;
      *r = in[lVar6];
      *g = in[lVar6 + 1];
      bVar1 = in[lVar6 + 2];
      *b = bVar1;
      if (((mode->key_defined != 0) && (mode->key_r == (uint)*r)) &&
         ((mode->key_g == (uint)*g && (mode->key_b == (uint)bVar1)))) goto LAB_002f9801;
    }
    else {
      lVar6 = i * 6;
      *r = in[lVar6];
      *g = in[lVar6 + 2];
      uVar2 = in[lVar6 + 4];
      *b = uVar2;
      if ((((mode->key_defined != 0) &&
           ((uint)(ushort)(*(ushort *)(in + lVar6) << 8 | *(ushort *)(in + lVar6) >> 8) ==
            mode->key_r)) &&
          (uVar7 = swap_bytes(*(undefined2 *)(in + lVar6 + 2)), (uint)uVar7 == mode->key_g)) &&
         ((uint)CONCAT11(uVar2,in[lVar6 + 5]) == mode->key_b)) goto LAB_002f9801;
    }
LAB_002f9806:
    *a = 0xff;
    return;
  case LCT_PALETTE:
    uVar5 = (ulong)mode->bitdepth;
    if (uVar5 == 8) {
      uVar3 = (uint)in[i];
    }
    else {
      j = i * uVar5;
      uVar3 = readBitsFromReversedStream(&j,in,uVar5);
    }
    if ((ulong)uVar3 < mode->palettesize) {
      uVar5 = (ulong)(uVar3 << 2);
      *r = mode->palette[uVar5];
      *g = mode->palette[uVar5 + 1];
      *b = mode->palette[uVar5 + 2];
      uVar2 = mode->palette[uVar5 + 3];
    }
    else {
      *b = '\0';
      *g = '\0';
      *r = '\0';
      uVar2 = 0xff;
    }
    break;
  case LCT_GREY_ALPHA:
    if (mode->bitdepth == 8) {
      uVar2 = in[i * 2];
      *b = uVar2;
      *g = uVar2;
      *r = uVar2;
      uVar2 = in[i * 2 + 1];
    }
    else {
      uVar2 = in[i * 4];
      *b = uVar2;
      *g = uVar2;
      *r = uVar2;
      uVar2 = in[i * 4 + 2];
    }
    break;
  case LCT_RGBA:
    if (mode->bitdepth == 8) {
      *r = in[i * 4];
      *g = in[i * 4 + 1];
      *b = in[i * 4 + 2];
      uVar2 = in[i * 4 + 3];
    }
    else {
      *r = in[i * 8];
      *g = in[i * 8 + 2];
      *b = in[i * 8 + 4];
      uVar2 = in[i * 8 + 6];
    }
  }
  *a = uVar2;
switchD_002f95d8_caseD_1:
  return;
}

Assistant:

static void getPixelColorRGBA8(unsigned char* r, unsigned char* g,
                               unsigned char* b, unsigned char* a,
                               const unsigned char* in, size_t i,
                               const LodePNGColorMode* mode)
{
  if(mode->colortype == LCT_GREY)
  {
    if(mode->bitdepth == 8)
    {
      *r = *g = *b = in[i];
      if(mode->key_defined && *r == mode->key_r) *a = 0;
      else *a = 255;
    }
    else if(mode->bitdepth == 16)
    {
      *r = *g = *b = in[i * 2 + 0];
      if(mode->key_defined && 256U * in[i * 2 + 0] + in[i * 2 + 1] == mode->key_r) *a = 0;
      else *a = 255;
    }
    else
    {
      unsigned highest = ((1U << mode->bitdepth) - 1U); /*highest possible value for this bit depth*/
      size_t j = i * mode->bitdepth;
      unsigned value = readBitsFromReversedStream(&j, in, mode->bitdepth);
      *r = *g = *b = (value * 255) / highest;
      if(mode->key_defined && value == mode->key_r) *a = 0;
      else *a = 255;
    }
  }
  else if(mode->colortype == LCT_RGB)
  {
    if(mode->bitdepth == 8)
    {
      *r = in[i * 3 + 0]; *g = in[i * 3 + 1]; *b = in[i * 3 + 2];
      if(mode->key_defined && *r == mode->key_r && *g == mode->key_g && *b == mode->key_b) *a = 0;
      else *a = 255;
    }
    else
    {
      *r = in[i * 6 + 0];
      *g = in[i * 6 + 2];
      *b = in[i * 6 + 4];
      if(mode->key_defined && 256U * in[i * 6 + 0] + in[i * 6 + 1] == mode->key_r
         && 256U * in[i * 6 + 2] + in[i * 6 + 3] == mode->key_g
         && 256U * in[i * 6 + 4] + in[i * 6 + 5] == mode->key_b) *a = 0;
      else *a = 255;
    }
  }
  else if(mode->colortype == LCT_PALETTE)
  {
    unsigned index;
    if(mode->bitdepth == 8) index = in[i];
    else
    {
      size_t j = i * mode->bitdepth;
      index = readBitsFromReversedStream(&j, in, mode->bitdepth);
    }

    if(index >= mode->palettesize)
    {
      /*This is an error according to the PNG spec, but common PNG decoders make it black instead.
      Done here too, slightly faster due to no error handling needed.*/
      *r = *g = *b = 0;
      *a = 255;
    }
    else
    {
      *r = mode->palette[index * 4 + 0];
      *g = mode->palette[index * 4 + 1];
      *b = mode->palette[index * 4 + 2];
      *a = mode->palette[index * 4 + 3];
    }
  }
  else if(mode->colortype == LCT_GREY_ALPHA)
  {
    if(mode->bitdepth == 8)
    {
      *r = *g = *b = in[i * 2 + 0];
      *a = in[i * 2 + 1];
    }
    else
    {
      *r = *g = *b = in[i * 4 + 0];
      *a = in[i * 4 + 2];
    }
  }
  else if(mode->colortype == LCT_RGBA)
  {
    if(mode->bitdepth == 8)
    {
      *r = in[i * 4 + 0];
      *g = in[i * 4 + 1];
      *b = in[i * 4 + 2];
      *a = in[i * 4 + 3];
    }
    else
    {
      *r = in[i * 8 + 0];
      *g = in[i * 8 + 2];
      *b = in[i * 8 + 4];
      *a = in[i * 8 + 6];
    }
  }
}